

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

int __thiscall
glslang::TParseContext::getIoArrayImplicitSize
          (TParseContext *this,TQualifier *qualifier,TString *featureString)

{
  EShLanguage EVar1;
  TIntermediate *pTVar2;
  uint uVar3;
  size_t __len2;
  int iVar4;
  char *pcVar5;
  int iVar6;
  TString str;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_50;
  
  local_50._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  _M_construct<char_const*>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_50,
             "unknown","");
  pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  iVar6 = pTVar2->vertices;
  if (iVar6 == -1) {
    iVar6 = 0;
  }
  EVar1 = (this->super_TParseContextBase).super_TParseVersions.language;
  if ((int)EVar1 < 4) {
    if (EVar1 == EShLangTessControl) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      _M_replace(&local_50,0,local_50._M_string_length,"vertices",8);
      iVar4 = iVar6;
      goto LAB_0041dd48;
    }
    iVar4 = 0;
    if (EVar1 != EShLangGeometry) goto LAB_0041dd48;
    uVar3 = pTVar2->inputPrimitive - ElgPoints;
    iVar4 = 0;
    if (uVar3 < 6) {
      iVar4 = *(int *)(&DAT_00748584 + (ulong)uVar3 * 4);
    }
    if (uVar3 < 9) {
      pcVar5 = *(char **)(&DAT_00942d40 + (ulong)uVar3 * 8);
    }
    else {
      pcVar5 = "none";
    }
    __len2 = strlen(pcVar5);
  }
  else {
    if (EVar1 == EShLangFragment) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      _M_replace(&local_50,0,local_50._M_string_length,"vertices",8);
      iVar4 = 3;
      goto LAB_0041dd48;
    }
    iVar4 = 0;
    if (EVar1 != EShLangMesh) goto LAB_0041dd48;
    iVar4 = 0;
    if (pTVar2->primitives != -1) {
      iVar4 = pTVar2->primitives;
    }
    uVar3 = (uint)(*(ulong *)&qualifier->field_0x8 >> 7) & 0x1ff;
    if (2 < uVar3 - 0x89) {
      if (uVar3 == 0x79) {
        uVar3 = pTVar2->outputPrimitive - ElgPoints;
        iVar6 = 0;
        if (uVar3 < 6) {
          iVar6 = *(int *)(&DAT_00748584 + (ulong)uVar3 * 4);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        _M_replace(&local_50,0,local_50._M_string_length,"max_primitives*",0xf);
        uVar3 = ((this->super_TParseContextBase).super_TParseVersions.intermediate)->outputPrimitive
                - ElgPoints;
        if (uVar3 < 9) {
          pcVar5 = *(char **)(&DAT_00942d40 + (ulong)uVar3 * 8);
        }
        else {
          pcVar5 = "none";
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&local_50,pcVar5);
        iVar4 = iVar4 * iVar6;
      }
      else if ((*(ulong *)&qualifier->field_0x8 >> 0x29 & 1) == 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        operator=(&local_50,"max_vertices");
        iVar4 = iVar6;
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        operator=(&local_50,"max_primitives");
      }
      goto LAB_0041dd48;
    }
    pcVar5 = "max_primitives";
    __len2 = 0xe;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  _M_replace(&local_50,0,local_50._M_string_length,pcVar5,__len2);
LAB_0041dd48:
  if (featureString != (TString *)0x0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    _M_assign(featureString,&local_50);
  }
  return iVar4;
}

Assistant:

int TParseContext::getIoArrayImplicitSize(const TQualifier &qualifier, TString *featureString) const
{
    int expectedSize = 0;
    TString str = "unknown";
    unsigned int maxVertices = intermediate.getVertices() != TQualifier::layoutNotSet ? intermediate.getVertices() : 0;

    if (language == EShLangGeometry) {
        expectedSize = TQualifier::mapGeometryToSize(intermediate.getInputPrimitive());
        str = TQualifier::getGeometryString(intermediate.getInputPrimitive());
    }
    else if (language == EShLangTessControl) {
        expectedSize = maxVertices;
        str = "vertices";
    } else if (language == EShLangFragment) {
        // Number of vertices for Fragment shader is always three.
        expectedSize = 3;
        str = "vertices";
    } else if (language == EShLangMesh) {
        unsigned int maxPrimitives =
            intermediate.getPrimitives() != TQualifier::layoutNotSet ? intermediate.getPrimitives() : 0;
        if (qualifier.builtIn == EbvPrimitiveIndicesNV) {
            expectedSize = maxPrimitives * TQualifier::mapGeometryToSize(intermediate.getOutputPrimitive());
            str = "max_primitives*";
            str += TQualifier::getGeometryString(intermediate.getOutputPrimitive());
        }
        else if (qualifier.builtIn == EbvPrimitiveTriangleIndicesEXT || qualifier.builtIn == EbvPrimitiveLineIndicesEXT ||
                 qualifier.builtIn == EbvPrimitivePointIndicesEXT) {
            expectedSize = maxPrimitives;
            str = "max_primitives";
        }
        else if (qualifier.isPerPrimitive()) {
            expectedSize = maxPrimitives;
            str = "max_primitives";
        }
        else {
            expectedSize = maxVertices;
            str = "max_vertices";
        }
    }
    if (featureString)
        *featureString = str;
    return expectedSize;
}